

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void main_reestimate(model_inventory_t *inv,lexicon_t *lex,model_def_t *mdef,feat_t *feat,
                    int32 viterbi)

{
  double dVar1;
  uint32 uVar2;
  int iVar3;
  int32 iVar4;
  cmd_ln_t *pcVar5;
  long lVar6;
  long lVar7;
  bw_timers_t *timers;
  long lVar8;
  long lVar9;
  char *__dest;
  state_t *state;
  size_t sVar10;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  mfcc_t ***feat_00;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  int32 n_frame;
  uint local_1a4;
  FILE *local_1a0;
  uint local_194;
  double local_190;
  model_inventory_t *local_188;
  ptmr_t *local_180;
  vector_t *mfcc;
  uint32 n_state;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  float local_134;
  uint local_130;
  uint local_12c;
  feat_t *local_128;
  mfcc_t ***local_120;
  long local_118;
  time_t t;
  char *trans;
  float64 log_lik;
  int32 local_f4;
  double local_f0;
  char *local_e8;
  ulong local_e0;
  s3phseg_t *phseg;
  size_t local_d0;
  double local_c8;
  long local_c0;
  lexicon_t *local_b8;
  model_def_t *local_b0;
  ptmr_t *local_a8;
  ptmr_t *local_a0;
  ptmr_t *local_98;
  ptmr_t *local_90;
  ptmr_t *local_88;
  undefined8 local_80;
  char time_str [64];
  
  n_state = 0;
  phseg = (s3phseg_t *)0x0;
  pcVar12 = "Viterbi";
  if (viterbi == 0) {
    pcVar12 = "Baum-Welch";
  }
  local_188 = inv;
  local_b8 = lex;
  local_b0 = mdef;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
          ,0x27d,"Reestimation: %s\n",pcVar12);
  pcVar5 = cmd_ln_get();
  lVar6 = cmd_ln_int_r(pcVar5,"-timing");
  if ((int)lVar6 != 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x281,"Generating profiling information consumes significant CPU resources.\n");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x282,"If you are not interested in profiling, use -timing no\n");
  }
  pcVar5 = cmd_ln_get();
  lVar7 = cmd_ln_int_r(pcVar5,"-outputfullpath");
  local_e0 = 0;
  if ((int)lVar6 == 0) {
    timers = (bw_timers_t *)0x0;
  }
  else {
    timers = (bw_timers_t *)
             __ckd_calloc__(1,0x1c0,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                            ,0x287);
    ptmr_init((ptmr_t *)timers);
    ptmr_init(&timers->upd_timer);
    ptmr_init(&timers->fwd_timer);
    ptmr_init(&timers->bwd_timer);
    ptmr_init(&timers->gau_timer);
    ptmr_init(&timers->rsts_timer);
    ptmr_init(&timers->rstf_timer);
    ptmr_init(&timers->rstu_timer);
  }
  pcVar5 = cmd_ln_get();
  local_150 = cmd_ln_int_r(pcVar5,"-mixwreest");
  pcVar5 = cmd_ln_get();
  local_158 = cmd_ln_int_r(pcVar5,"-tmatreest");
  pcVar5 = cmd_ln_get();
  local_160 = cmd_ln_int_r(pcVar5,"-meanreest");
  pcVar5 = cmd_ln_get();
  local_168 = cmd_ln_int_r(pcVar5,"-varreest");
  pcVar5 = cmd_ln_get();
  local_140 = cmd_ln_int_r(pcVar5,"-2passvar");
  pcVar5 = cmd_ln_get();
  local_148 = cmd_ln_int_r(pcVar5,"-fullvar");
  pcVar5 = cmd_ln_get();
  local_e8 = cmd_ln_str_r(pcVar5,"-pdumpdir");
  pcVar5 = cmd_ln_get();
  lVar8 = cmd_ln_int_r(pcVar5,"-ceplen");
  pcVar5 = cmd_ln_get();
  pcVar12 = cmd_ln_str_r(pcVar5,"-ckptintv");
  if (pcVar12 != (char *)0x0) {
    pcVar5 = cmd_ln_get();
    local_e0 = cmd_ln_int_r(pcVar5,"-ckptintv");
  }
  pcVar5 = cmd_ln_get();
  pcVar12 = cmd_ln_str_r(pcVar5,"-accumdir");
  if (pcVar12 == (char *)0x0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x2a0,"NO ACCUMDIR SET.  No counts will be written; assuming debug\n");
  }
  if ((((int)local_150 == 0 && (int)local_158 == 0) && (int)local_160 == 0) && (int)local_168 == 0)
  {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x2a4,"No reestimation specified!  None done.\n");
    return;
  }
  local_128 = feat;
  local_f4 = viterbi;
  pcVar5 = cmd_ln_get();
  local_f0 = cmd_ln_float_r(pcVar5,"-abeam");
  pcVar5 = cmd_ln_get();
  local_c8 = cmd_ln_float_r(pcVar5,"-bbeam");
  pcVar5 = cmd_ln_get();
  local_180 = (ptmr_t *)cmd_ln_float_r(pcVar5,"-spthresh");
  pcVar5 = cmd_ln_get();
  local_c0 = cmd_ln_int_r(pcVar5,"-maxuttlen");
  uVar2 = corpus_get_begin();
  puts("column defns");
  puts("\t<seq>");
  puts("\t<id>");
  puts("\t<n_frame_in>");
  puts("\t<n_frame_del>");
  puts("\t<n_state_shmm>");
  puts("\t<avg_states_alpha>");
  pcVar5 = cmd_ln_get();
  lVar9 = cmd_ln_int_r(pcVar5,"-viterbi");
  if ((int)lVar9 == 0) {
    puts("\t<avg_states_beta>");
    puts("\t<avg_states_reest>");
    puts("\t<avg_posterior_prune>");
  }
  local_118 = lVar6;
  puts("\t<frame_log_lik>");
  puts("\t<utt_log_lik>");
  puts("\t... timing info ... ");
  iVar3 = corpus_next_utt();
  if (iVar3 != 0) {
    local_134 = (float)(double)local_180;
    local_180 = &timers->upd_timer;
    local_80 = &timers->fwd_timer;
    local_88 = &timers->bwd_timer;
    local_90 = &timers->gau_timer;
    local_98 = &timers->rsts_timer;
    local_a0 = &timers->rstf_timer;
    local_a8 = &timers->rstu_timer;
    local_190 = 0.0;
    local_194 = 0;
    local_12c = 0;
    uVar11 = 0;
    local_130 = 0;
LAB_00108cb9:
    local_1a4 = (uint)uVar11;
    do {
      if (timers != (bw_timers_t *)0x0) {
        ptmr_reset(&timers->utt_timer);
        ptmr_reset(local_180);
        ptmr_reset(local_80);
        ptmr_reset(local_88);
        ptmr_reset(local_90);
        ptmr_reset(local_98);
        ptmr_reset(local_a0);
        ptmr_reset(local_a8);
        ptmr_start(&timers->utt_timer);
      }
      if ((int)lVar7 == 0) {
        pcVar12 = corpus_utt();
      }
      else {
        pcVar12 = corpus_utt_full_name();
      }
      printf("utt> %5u %25s",(ulong)uVar2,pcVar12);
      iVar3 = corpus_get_generic_featurevec(&mfcc,&n_frame,(uint32)lVar8);
      if (iVar3 < 0) {
        pcVar12 = "Can\'t read input features\n";
        lVar6 = 0x2de;
        goto LAB_00109761;
      }
      printf(" %4u",(ulong)(uint)n_frame);
      iVar4 = n_frame;
      if (n_frame < 9) {
        pcVar12 = corpus_utt();
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x2e4,"utt %s too short\n",pcVar12);
        if (mfcc != (vector_t *)0x0) {
          ckd_free(*mfcc);
          ckd_free(mfcc);
        }
        iVar3 = corpus_next_utt();
      }
      else {
        if (((uint)local_c0 == 0) || ((uint)n_frame <= (uint)local_c0)) goto LAB_00108e4b;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x2ed,"utt # frames > -maxuttlen; skipping\n");
        local_1a4 = local_1a4 + n_frame;
        if (mfcc != (vector_t *)0x0) {
          ckd_free(*mfcc);
          ckd_free(mfcc);
        }
        iVar3 = corpus_next_utt();
      }
      if (iVar3 == 0) {
        uVar11 = (ulong)local_1a4;
        dVar14 = local_190;
        goto LAB_00109500;
      }
    } while( true );
  }
  local_194 = 0;
  uVar11 = 0;
  dVar14 = 0.0;
LAB_00109500:
  uVar13 = local_194;
  dVar15 = 0.0;
  local_180 = (ptmr_t *)(double)local_194;
  if (local_194 != 0) {
    dVar15 = dVar14 / (double)local_180;
  }
  printf("overall> stats %u (-%u) %e %e",dVar15,(ulong)local_194,uVar11);
  if ((int)local_118 != 0) {
    dVar14 = (double)(timers->utt_timer).t_tot_cpu;
    dVar16 = 0.0;
    dVar15 = 0.0;
    if (uVar13 != 0) {
      dVar15 = dVar14 / ((double)local_180 * 0.01);
    }
    if (0.0 < dVar14) {
      dVar16 = (double)(timers->utt_timer).t_tot_elapsed / dVar14;
    }
    printf(" %4.3fx %4.3fe",dVar15,dVar16);
  }
  putchar(10);
  fflush(_stdout);
  pcVar5 = cmd_ln_get();
  pcVar12 = cmd_ln_str_r(pcVar5,"-accumdir");
  if (pcVar12 != (char *)0x0) {
    uVar13 = 0;
    do {
      pcVar5 = cmd_ln_get();
      pcVar12 = cmd_ln_str_r(pcVar5,"-accumdir");
      iVar4 = accum_dump(pcVar12,local_188,(int32)local_150,(int32)local_158,(int32)local_160,
                         (int32)local_168,(int32)local_140,(int32)local_148,0);
      if (iVar4 == 0) break;
      if (main_reestimate_notified_55 == '\0') {
        t = time((time_t *)0x0);
        pcVar12 = ctime(&t);
        strcpy(time_str,pcVar12);
        sVar10 = strlen(time_str);
        time_str[sVar10 - 1] = '\0';
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x3b7,"Count dump failed on %s.  Retrying dump every %3.1f hour until success.\n",
                0x3f4b4e81b4e81b4f,time_str);
        main_reestimate_notified_55 = '\x01';
        uVar13 = uVar13 + 1;
        if (10 < uVar13) {
          pcVar12 = "Failed to get the files after 10 retries(about 5 minutes).\n ";
          lVar6 = 0x3bc;
LAB_00109761:
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                  ,lVar6,pcVar12);
LAB_0010976d:
          exit(1);
        }
      }
      sleep(3);
      pcVar5 = cmd_ln_get();
      pcVar12 = cmd_ln_str_r(pcVar5,"-accumdir");
    } while (pcVar12 != (char *)0x0);
  }
  if ((int)local_118 != 0) {
    ckd_free(timers);
  }
  pcVar5 = cmd_ln_get();
  pcVar12 = cmd_ln_str_r(pcVar5,"-accumdir");
  if (pcVar12 == (char *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x3cd,"Counts NOT saved.\n");
  }
  else {
    pcVar5 = cmd_ln_get();
    pcVar12 = cmd_ln_str_r(pcVar5,"-accumdir");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x3cb,"Counts saved to %s\n",pcVar12);
  }
  return;
LAB_00108e4b:
  local_120 = feat_array_alloc(local_128,local_128->window_size + n_frame);
  feat_s2mfc2feat_live(local_128,(mfcc_t **)mfcc,&n_frame,1,1,local_120);
  printf(" %4u",(ulong)(uint)(n_frame - iVar4));
  corpus_get_sent(&trans);
  corpus_get_phseg(local_188->acmod_set,&phseg);
  if (local_e8 == (char *)0x0) {
    local_1a0 = (FILE *)0x0;
  }
  else {
    if ((int)lVar7 == 0) {
      local_1a0 = (FILE *)corpus_utt();
    }
    else {
      local_1a0 = (FILE *)corpus_utt_full_name();
    }
    pcVar12 = local_e8;
    local_d0 = strlen(local_e8);
    sVar10 = strlen((char *)local_1a0);
    __dest = (char *)__ckd_calloc__(local_d0 + sVar10 + 8,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                    ,0x30b);
    strcpy(__dest,pcVar12);
    sVar10 = strlen(__dest);
    (__dest + sVar10)[0] = '/';
    (__dest + sVar10)[1] = '\0';
    strcat(__dest,(char *)local_1a0);
    sVar10 = strlen(__dest);
    builtin_strncpy(__dest + sVar10,".pdump",7);
    local_1a0 = fopen(__dest,"w");
    if (local_1a0 == (FILE *)0x0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                     ,0x311,"Failed to open %s for writing",__dest);
      goto LAB_0010976d;
    }
    ckd_free(__dest);
  }
  if (timers != (bw_timers_t *)0x0) {
    ptmr_start(local_180);
  }
  state = next_utt_states(&n_state,local_b8,local_188,local_b0,trans);
  printf(" %5u",(ulong)n_state);
  feat_00 = local_120;
  if (state == (state_t *)0x0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
            ,0x31e,"Skipped utterance \'%s\'\n",trans);
    feat_00 = local_120;
  }
  else {
    if (local_f4 == 0) {
      iVar3 = baum_welch_update(&log_lik,(vector_t **)local_120,n_frame,state,n_state,local_188,
                                (float64)local_f0,(float64)local_c8,(float32)local_134,phseg,
                                (int32)local_150,(int32)local_158,(int32)local_160,(int32)local_168,
                                (int32)local_140,(int32)local_148,(FILE *)local_1a0,timers,local_128
                               );
    }
    else {
      iVar3 = viterbi_update(&log_lik,(vector_t **)local_120,n_frame,state,n_state,local_188,
                             (float64)local_f0,(float32)local_134,phseg,(int32)local_150,
                             (int32)local_158,(int32)local_160,(int32)local_168,(int32)local_140,
                             (int32)local_148,(FILE *)local_1a0,timers,local_128);
    }
    if (iVar3 == 0) {
      if (n_frame < 1) {
        dVar14 = 0.0;
      }
      else {
        dVar14 = (double)log_lik / (double)n_frame;
      }
      local_194 = local_194 + n_frame;
      local_190 = local_190 + (double)log_lik;
      printf(" %e %e",dVar14);
    }
  }
  if (timers != (bw_timers_t *)0x0) {
    ptmr_stop(local_180);
  }
  if (local_1a0 != (FILE *)0x0) {
    fclose(local_1a0);
  }
  free(*mfcc);
  ckd_free(mfcc);
  feat_array_free(feat_00);
  free(trans);
  if (timers != (bw_timers_t *)0x0) {
    ptmr_stop(&timers->utt_timer);
  }
  if ((int)local_118 != 0) {
    dVar14 = (double)(timers->utt_timer).t_cpu;
    dVar15 = 0.0;
    local_1a0 = (FILE *)0x0;
    if (0.0 < dVar14) {
      local_1a0 = (FILE *)((double)(timers->utt_timer).t_elapsed / dVar14);
    }
    dVar16 = (double)(timers->upd_timer).t_cpu;
    if (0.0 < dVar16) {
      dVar15 = (double)(timers->upd_timer).t_elapsed / dVar16;
    }
    dVar1 = (double)(timers->fwd_timer).t_cpu;
    dVar17 = 0.0;
    if (0.0 < dVar1) {
      dVar17 = (double)(timers->fwd_timer).t_elapsed / dVar1;
    }
    dVar18 = (double)n_frame * 0.01;
    printf(" utt %4.3fx %4.3fe upd %4.3fx %4.3fe fwd %4.3fx %4.3fe bwd %4.3fx %4.3fe gau %4.3fx %4.3fe rsts %4.3fx %4.3fe rstf %4.3fx %4.3fe rstu %4.3fx %4.3fe"
           ,dVar14 / dVar18,local_1a0,dVar16 / dVar18,dVar15,dVar1 / dVar18,dVar17,
           (double)(timers->bwd_timer).t_cpu / dVar18);
    putchar(10);
  }
  uVar13 = local_130 + 1;
  putchar(10);
  fflush(_stdout);
  local_130 = uVar13;
  if (((int)local_e0 != 0) && ((int)((ulong)uVar13 % (local_e0 & 0xffffffff)) == 0)) {
    pcVar5 = cmd_ln_get();
    pcVar12 = cmd_ln_str_r(pcVar5,"-accumdir");
    if (pcVar12 != (char *)0x0) {
      while( true ) {
        pcVar5 = cmd_ln_get();
        pcVar12 = cmd_ln_str_r(pcVar5,"-accumdir");
        iVar4 = accum_dump(pcVar12,local_188,(int32)local_150,(int32)local_158,(int32)local_160,
                           (int32)local_168,(int32)local_140,(int32)local_148,1);
        if (iVar4 == 0) break;
        if (main_reestimate_notified == '\0') {
          t = time((time_t *)0x0);
          pcVar12 = ctime(&t);
          strcpy(time_str,pcVar12);
          sVar10 = strlen(time_str);
          time_str[sVar10 - 1] = '\0';
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                  ,900,
                  "Ckpt count dump failed on %s.  Retrying dump every %3.1f hour until success.\n",
                  0x3f4b4e81b4e81b4f,time_str);
          main_reestimate_notified = '\x01';
          local_12c = local_12c + 1;
          if (10 < local_12c) {
            pcVar12 = "Failed to get the files after 10 retries(about 5 minutes).\n ";
            lVar6 = 0x389;
            goto LAB_00109761;
          }
        }
        sleep(3);
      }
    }
  }
  uVar2 = uVar2 + 1;
  iVar3 = corpus_next_utt();
  uVar11 = (ulong)local_1a4;
  dVar14 = local_190;
  if (iVar3 == 0) goto LAB_00109500;
  goto LAB_00108cb9;
}

Assistant:

void
main_reestimate(model_inventory_t *inv,
		lexicon_t *lex,
		model_def_t *mdef,
		feat_t *feat,
		int32 viterbi)
{
    vector_t *mfcc;	/* utterance cepstra */	
    int32 n_frame;	/* # of cepstrum frames  */
    uint32 svd_n_frame;	/* # of cepstrum frames  */
    vector_t **f;		/* independent feature streams derived
				 * from cepstra */
    state_t *state_seq;		/* sentence HMM state sequence for the
				   utterance */
    uint32 n_state = 0;	/* # of sentence HMM states */
    float64 total_log_lik;	/* total log liklihood over corpus */
    float64 log_lik;		/* log liklihood for an utterance */
    uint32 total_frames;	/* # of frames over the corpus */
    float64 a_beam;		/* alpha pruning beam */
    float64 b_beam;		/* beta pruning beam */
    float32 spthresh;		/* state posterior probability threshold */
    uint32 seq_no;	/* sequence # of utterance in corpus */
    uint32 mixw_reest;	/* if TRUE, reestimate mixing weights */
    uint32 tmat_reest;	/* if TRUE, reestimate transition probability matrices */
    uint32 mean_reest;	/* if TRUE, reestimate means */
    uint32 var_reest;	/* if TRUE, reestimate variances */
    char *trans;
    const char *pdumpdir;
    FILE *pdumpfh;
    uint32 in_veclen;

    bw_timers_t* timers = NULL;
    int32 profile;

    int32 pass2var;
    int32 var_is_full;

    uint32 n_utt;

    s3phseg_t *phseg = NULL;

    uint32 maxuttlen;
    uint32 n_frame_skipped = 0;

    uint32 ckpt_intv = 0;
    uint32 no_retries = 0;

    uint32 outputfullpath = 0;

    E_INFO("Reestimation: %s\n",
	(viterbi ? "Viterbi" : "Baum-Welch"));

    profile = cmd_ln_int32("-timing");
    if (profile) {
	E_INFO("Generating profiling information consumes significant CPU resources.\n");
	E_INFO("If you are not interested in profiling, use -timing no\n");
    }
    outputfullpath = cmd_ln_int32("-outputfullpath");

    if (profile) {
	timers = ckd_calloc(1, sizeof(bw_timers_t));
	ptmr_init(&timers->utt_timer);
	ptmr_init(&timers->upd_timer);
	ptmr_init(&timers->fwd_timer);
	ptmr_init(&timers->bwd_timer);
	ptmr_init(&timers->gau_timer);
	ptmr_init(&timers->rsts_timer);
	ptmr_init(&timers->rstf_timer);
	ptmr_init(&timers->rstu_timer);
    }

    mixw_reest = cmd_ln_int32("-mixwreest");
    tmat_reest = cmd_ln_int32("-tmatreest");
    mean_reest = cmd_ln_int32("-meanreest");
    var_reest = cmd_ln_int32("-varreest");
    pass2var = cmd_ln_int32("-2passvar");
    var_is_full = cmd_ln_int32("-fullvar");
    pdumpdir = cmd_ln_str("-pdumpdir");
    in_veclen = cmd_ln_int32("-ceplen");

    if (cmd_ln_str("-ckptintv")) {
	ckpt_intv = cmd_ln_int32("-ckptintv");
    }

    if (cmd_ln_str("-accumdir") == NULL) {
	E_WARN("NO ACCUMDIR SET.  No counts will be written; assuming debug\n");
    }

    if (!mixw_reest && !tmat_reest && !mean_reest && !var_reest) {
	E_WARN("No reestimation specified!  None done.\n");
	
	return;
    }

    total_log_lik = 0;
    total_frames = 0;

    a_beam = cmd_ln_float64("-abeam");
    b_beam = cmd_ln_float64("-bbeam");
    spthresh = cmd_ln_float32("-spthresh");
    maxuttlen = cmd_ln_int32("-maxuttlen");

    /* Begin by skipping over some (possibly zero) # of utterances.
     * Continue to process utterances until there are no more (either EOF
     * or end of run). */

    seq_no = corpus_get_begin();

    printf("column defns\n");
    printf("\t<seq>\n");
    printf("\t<id>\n");
    printf("\t<n_frame_in>\n");
    printf("\t<n_frame_del>\n");
    printf("\t<n_state_shmm>\n");
    printf("\t<avg_states_alpha>\n");
    if (!cmd_ln_int32("-viterbi")) {
	printf("\t<avg_states_beta>\n");
	printf("\t<avg_states_reest>\n");
	printf("\t<avg_posterior_prune>\n");
    }
    printf("\t<frame_log_lik>\n");
    printf("\t<utt_log_lik>\n");
    printf("\t... timing info ... \n");

    n_utt = 0;

    while (corpus_next_utt()) {
	/* Zero timers before utt processing begins */
	if (timers) {
	    ptmr_reset(&timers->utt_timer);
	    ptmr_reset(&timers->upd_timer);
	    ptmr_reset(&timers->fwd_timer);
	    ptmr_reset(&timers->bwd_timer);
	    ptmr_reset(&timers->gau_timer);
	    ptmr_reset(&timers->rsts_timer);
	    ptmr_reset(&timers->rstf_timer);
	    ptmr_reset(&timers->rstu_timer);
	}
	
	if (timers)
	    ptmr_start(&timers->utt_timer);

	printf("utt> %5u %25s", 
	       seq_no,
	       (outputfullpath ? corpus_utt_full_name() : corpus_utt()));

        if (corpus_get_generic_featurevec(&mfcc, &n_frame, in_veclen) < 0) {
	        E_FATAL("Can't read input features\n");
	}

	printf(" %4u", n_frame);

	if (n_frame < 9) {
	    E_WARN("utt %s too short\n", corpus_utt());
	    if (mfcc) {
		ckd_free(mfcc[0]);
		ckd_free(mfcc);
	    }
	    continue;
	}

	if ((maxuttlen > 0) && (n_frame > maxuttlen)) {
	    E_INFO("utt # frames > -maxuttlen; skipping\n");
	    n_frame_skipped += n_frame;
	    if (mfcc) {
		ckd_free(mfcc[0]);
		ckd_free(mfcc);
	    }

	    continue;
	}

	svd_n_frame = n_frame;

	f = feat_array_alloc(feat, n_frame + feat_window_size(feat));
	feat_s2mfc2feat_live(feat, mfcc, &n_frame, TRUE, TRUE, f);

	printf(" %4u", n_frame - svd_n_frame);

	/* Get the transcript */
	corpus_get_sent(&trans);

	/* Get the phone segmentation */
	corpus_get_phseg(inv->acmod_set, &phseg);

	/* Open a dump file if required. */
	if (pdumpdir) {
		char *pdumpfn, *uttid;

		uttid = (outputfullpath ? corpus_utt_full_name() : corpus_utt());
		pdumpfn = ckd_calloc(strlen(pdumpdir) + 1
				     + strlen(uttid)
				     + strlen(".pdump") + 1, 1);
		strcpy(pdumpfn, pdumpdir);
		strcat(pdumpfn, "/");
		strcat(pdumpfn, uttid);
		strcat(pdumpfn, ".pdump");
		if ((pdumpfh = fopen(pdumpfn, "w")) == NULL)
			E_FATAL_SYSTEM("Failed to open %s for writing", pdumpfn);
		ckd_free(pdumpfn);
	}
	else
		pdumpfh = NULL;

        if (timers)
	    ptmr_start(&timers->upd_timer);
	/* create a sentence HMM */
	state_seq = next_utt_states(&n_state, lex, inv, mdef, trans);
	printf(" %5u", n_state);
	
	if (state_seq == NULL) {
	    E_WARN("Skipped utterance '%s'\n", trans);
	} else if (!viterbi) {
	    /* accumulate reestimation sums for the utterance */
	    if (baum_welch_update(&log_lik,
				  f, n_frame,
				  state_seq, n_state,
				  inv,
				  a_beam,
				  b_beam,
				  spthresh,
				  phseg,
				  mixw_reest,
				  tmat_reest,
				  mean_reest,
				  var_reest,
				  pass2var,
				  var_is_full,
				  pdumpfh,
				  timers,
				  feat) == S3_SUCCESS) {
		total_frames += n_frame;
		total_log_lik += log_lik;
		
		printf(" %e %e",
		       (n_frame > 0 ? log_lik / n_frame : 0.0),
		       log_lik);
	    }

	} else {
	    /* Viterbi search and accumulate in it */
	    if (viterbi_update(&log_lik,
			       f, n_frame,
			       state_seq, n_state,
			       inv,
			       a_beam,
			       spthresh,
			       phseg,
			       mixw_reest,
			       tmat_reest,
			       mean_reest,
			       var_reest,
			       pass2var,
			       var_is_full,
			       pdumpfh, 
			       timers,
			       feat) == S3_SUCCESS) {
		total_frames += n_frame;
		total_log_lik += log_lik;
		printf(" %e %e",
		       (n_frame > 0 ? log_lik / n_frame : 0.0),
		       log_lik);
	    }
	}

	if (timers)
	    ptmr_stop(&timers->upd_timer);

	if (pdumpfh)
		fclose(pdumpfh);
	free(mfcc[0]);
	ckd_free(mfcc);
	feat_array_free(f);
	free(trans);	/* alloc'ed using strdup() */

	seq_no++;
	n_utt++;

        if (timers)
	    ptmr_stop(&timers->utt_timer);
    
	if (profile)
	    print_all_timers(timers, n_frame);

	printf("\n");
	fflush(stdout);

	if ((ckpt_intv > 0) &&
	    ((n_utt % ckpt_intv) == 0) &&
	    (cmd_ln_str("-accumdir") != NULL)) {
	    while (accum_dump(cmd_ln_str("-accumdir"),
			      inv,
			      mixw_reest,
			      tmat_reest,
			      mean_reest,
			      var_reest,
			      pass2var,
			      var_is_full,
			      TRUE) != S3_SUCCESS) {
		static int notified = FALSE;
		time_t t;
		char time_str[64];
		
		/*
		 * If we were not able to dump the parameters, write one log entry
		 * about the failure
		 */
		if (notified == FALSE) {
		    t = time(NULL);
		    strcpy(time_str, (const char *)ctime((const time_t *)&t));
		    /* nuke the newline at the end of this. */
		    time_str[strlen(time_str)-1] = '\0';
		    E_WARN("Ckpt count dump failed on %s.  Retrying dump every %3.1f hour until success.\n",
			   time_str, DUMP_RETRY_PERIOD/3600.0);
		    
		    notified = TRUE;
		    no_retries++;
		    if(no_retries>10){ 
		      E_FATAL("Failed to get the files after 10 retries(about 5 minutes).\n ");
		    }
		}
		sleep(DUMP_RETRY_PERIOD);
	    }
	}
    }

    printf("overall> stats %u (-%u) %e %e",
	   total_frames,
	   n_frame_skipped,
	   (total_frames > 0 ? total_log_lik / total_frames : 0.0),
	   total_log_lik);
    if (profile) {
	printf(" %4.3fx %4.3fe",
	       (total_frames > 0 ? timers->utt_timer.t_tot_cpu/(total_frames*0.01) : 0.0),
	       (timers->utt_timer.t_tot_cpu > 0 ? timers->utt_timer.t_tot_elapsed / timers->utt_timer.t_tot_cpu : 0.0));
    }    
    printf("\n");
    fflush(stdout);

    no_retries=0;
    /* dump the accumulators to a file system */
    while (cmd_ln_str("-accumdir") != NULL &&
	   accum_dump(cmd_ln_str("-accumdir"), inv,
		      mixw_reest,
		      tmat_reest,
		      mean_reest,
		      var_reest,
		      pass2var,
		      var_is_full,
		      FALSE) != S3_SUCCESS) {
	static int notified = FALSE;
	time_t t;
	char time_str[64];

	/*
	 * If we were not able to dump the parameters, write one log entry
	 * about the failure
	 */
	if (notified == FALSE) {
	    t = time(NULL);
	    strcpy(time_str, (const char *)ctime((const time_t *)&t));
	    /* nuke the newline at the end of this. */
	    time_str[strlen(time_str)-1] = '\0';
	    E_WARN("Count dump failed on %s.  Retrying dump every %3.1f hour until success.\n",
		   time_str, DUMP_RETRY_PERIOD/3600.0);

	    notified = TRUE;
	    no_retries++;
	    if(no_retries>10){ 
	      E_FATAL("Failed to get the files after 10 retries(about 5 minutes).\n ");
	    }
	}
	
	sleep(DUMP_RETRY_PERIOD);


    }

    if (profile) {
	ckd_free(timers);
    }

    /* Write a log entry on success */
    if (cmd_ln_str("-accumdir"))
	E_INFO("Counts saved to %s\n", cmd_ln_str("-accumdir"));
    else
	E_INFO("Counts NOT saved.\n");
}